

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int64 __thiscall File::seek(File *this,int64 offset,Position start)

{
  __off64_t _Var1;
  int whence [3];
  Position start_local;
  int64 offset_local;
  File *this_local;
  
  stack0xffffffffffffffe8 = offset;
  whence[1] = start;
  whence[0] = 2;
  _Var1 = lseek64((int)this->fp,offset,whence[(ulong)start - 2]);
  return _Var1;
}

Assistant:

int64 File::seek(int64 offset, Position start)
{
#ifdef _WIN32
  DWORD moveMethod[3] = {FILE_BEGIN, FILE_CURRENT, FILE_END};
#ifndef _AMD64
  LARGE_INTEGER li;
  li.QuadPart = offset;
  li.LowPart = SetFilePointer((HANDLE)fp, li.LowPart, &li.HighPart, moveMethod[start]);
  if (li.LowPart == INVALID_SET_FILE_POINTER && GetLastError() != NO_ERROR)
    return -1;
  return li.QuadPart;
#else
  return SetFilePointer((HANDLE)fp, (LONG)offset, NULL, moveMethod[start]);
#endif
#else
  int whence[3] = {SEEK_SET, SEEK_CUR, SEEK_END};
  return lseek64((int)(intptr_t)fp, offset, whence[start]);
#endif
}